

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_smf_midiout.cpp
# Opt level: O0

void __thiscall MIDISong2::MIDISong2(MIDISong2 *this,FileReader *reader,EMidiDevice type,char *args)

{
  bool bVar1;
  undefined1 auVar2 [16];
  int iVar3;
  long lVar4;
  BYTE *pBVar5;
  undefined4 extraout_var;
  ulong uVar6;
  TrackInfo *pTVar7;
  uint local_40;
  DWORD chunkLen;
  int local_30;
  int local_2c;
  int i;
  int p;
  char *args_local;
  EMidiDevice type_local;
  FileReader *reader_local;
  MIDISong2 *this_local;
  
  MIDIStreamer::MIDIStreamer(&this->super_MIDIStreamer,type,args);
  (this->super_MIDIStreamer).super_MusInfo._vptr_MusInfo = (_func_int **)&PTR__MIDISong2_009f0568;
  this->MusHeader = (BYTE *)0x0;
  this->Tracks = (TrackInfo *)0x0;
  lVar4 = FileReader::GetLength(reader);
  this->SongLen = (int)lVar4;
  pBVar5 = (BYTE *)operator_new__((long)this->SongLen);
  this->MusHeader = pBVar5;
  iVar3 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[2])
                    (reader,this->MusHeader,(long)this->SongLen);
  if (((((CONCAT44(extraout_var,iVar3) == (long)this->SongLen) && (this->MusHeader[4] == '\0')) &&
       (this->MusHeader[5] == '\0')) &&
      ((this->MusHeader[6] == '\0' && (this->MusHeader[7] == '\x06')))) &&
     ((this->MusHeader[8] == '\0' && (this->MusHeader[9] < 3)))) {
    this->Format = (uint)this->MusHeader[9];
    if (this->Format == 0) {
      this->NumTracks = 1;
    }
    else {
      this->NumTracks = (uint)this->MusHeader[10] * 0x100 + (uint)this->MusHeader[0xb];
    }
    (this->super_MIDIStreamer).Division =
         (uint)this->MusHeader[0xc] * 0x100 + (uint)this->MusHeader[0xd];
    if ((this->super_MIDIStreamer).Division != 0) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)this->NumTracks;
      uVar6 = SUB168(auVar2 * ZEXT816(0x40),0);
      if (SUB168(auVar2 * ZEXT816(0x40),8) != 0) {
        uVar6 = 0xffffffffffffffff;
      }
      pTVar7 = (TrackInfo *)operator_new__(uVar6);
      this->Tracks = pTVar7;
      local_30 = 0;
      local_2c = 0xe;
      while( true ) {
        bVar1 = false;
        if (local_30 < this->NumTracks) {
          bVar1 = local_2c < this->SongLen + 8;
        }
        if (!bVar1) break;
        local_40 = (uint)this->MusHeader[local_2c + 4] << 0x18 |
                   (uint)this->MusHeader[local_2c + 5] << 0x10 |
                   (uint)this->MusHeader[local_2c + 6] << 8 | (uint)this->MusHeader[local_2c + 7];
        if ((uint)this->SongLen < local_40 + local_2c + 8) {
          local_40 = (this->SongLen - local_2c) - 8;
        }
        if (((this->MusHeader[local_2c] == 'M') && (this->MusHeader[local_2c + 1] == 'T')) &&
           ((this->MusHeader[local_2c + 2] == 'r' && (this->MusHeader[local_2c + 3] == 'k')))) {
          this->Tracks[local_30].TrackBegin = this->MusHeader + (long)local_2c + 8;
          this->Tracks[local_30].TrackP = 0;
          this->Tracks[local_30].MaxTrackP = (ulong)local_40;
        }
        local_2c = local_40 + 8 + local_2c;
        local_30 = local_30 + 1;
      }
      this->NumTracks = local_30;
    }
  }
  return;
}

Assistant:

MIDISong2::MIDISong2 (FileReader &reader, EMidiDevice type, const char *args)
: MIDIStreamer(type, args), MusHeader(0), Tracks(0)
{
	int p;
	int i;

#ifdef _WIN32
	if (ExitEvent == NULL)
	{
		return;
	}
#endif
	SongLen = reader.GetLength();
	MusHeader = new BYTE[SongLen];
	if (reader.Read(MusHeader, SongLen) != SongLen)
		return;

	// Do some validation of the MIDI file
	if (MusHeader[4] != 0 || MusHeader[5] != 0 || MusHeader[6] != 0 || MusHeader[7] != 6)
		return;

	if (MusHeader[8] != 0 || MusHeader[9] > 2)
		return;

	Format = MusHeader[9];

	if (Format == 0)
	{
		NumTracks = 1;
	}
	else
	{
		NumTracks = MusHeader[10] * 256 + MusHeader[11];
	}

	// The division is the number of pulses per quarter note (PPQN).
	Division = MusHeader[12] * 256 + MusHeader[13];
	if (Division == 0)
	{ // PPQN is zero? Then the song cannot play because it never pulses.
		return;
	}

	Tracks = new TrackInfo[NumTracks];

	// Gather information about each track
	for (i = 0, p = 14; i < NumTracks && p < SongLen + 8; ++i)
	{
		DWORD chunkLen =
			(MusHeader[p+4]<<24) |
			(MusHeader[p+5]<<16) |
			(MusHeader[p+6]<<8)  |
			(MusHeader[p+7]);

		if (chunkLen + p + 8 > (DWORD)SongLen)
		{ // Track too long, so truncate it
			chunkLen = SongLen - p - 8;
		}

		if (MusHeader[p+0] == 'M' &&
			MusHeader[p+1] == 'T' &&
			MusHeader[p+2] == 'r' &&
			MusHeader[p+3] == 'k')
		{
			Tracks[i].TrackBegin = MusHeader + p + 8;
			Tracks[i].TrackP = 0;
			Tracks[i].MaxTrackP = chunkLen;
		}

		p += chunkLen + 8;
	}

	// In case there were fewer actual chunks in the file than the
	// header specified, update NumTracks with the current value of i
	NumTracks = i;

	if (NumTracks == 0)
	{ // No tracks, so nothing to play
		return;
	}
}